

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_Graphics_Driver::write85
          (Fl_PostScript_Graphics_Driver *this,void *data,uchar *p,int len)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uchar *puVar6;
  struct85 *big;
  
  if (0 < len) {
    puVar6 = p + len;
    do {
      lVar4 = 4 - (long)*(int *)((long)data + 4);
      lVar5 = (long)puVar6 - (long)p;
      if (lVar4 <= lVar5) {
        lVar5 = lVar4;
      }
      iVar1 = (int)lVar5;
      memcpy((void *)((long)*(int *)((long)data + 4) + (long)data),p,(long)iVar1);
      iVar2 = *(int *)((long)data + 4) + iVar1;
      *(int *)((long)data + 4) = iVar2;
      if (iVar2 == 4) {
        uVar3 = convert85((uchar *)data,(uchar *)((long)data + 0xc));
        fwrite((uchar *)((long)data + 0xc),(ulong)uVar3,1,(FILE *)this->output);
        *(undefined4 *)((long)data + 4) = 0;
        iVar2 = *(int *)((long)data + 8);
        *(int *)((long)data + 8) = iVar2 + 1;
        if (0xe < iVar2) {
          fputc(10,(FILE *)this->output);
          *(undefined4 *)((long)data + 8) = 0;
        }
      }
      p = p + iVar1;
    } while (p < puVar6);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::write85(void *data, const uchar *p, int len) // sends len input bytes for ASCII85 encoding
{
  struct85 *big = (struct85 *)data;
  const uchar *last = p + len;
  while (p < last) {
    int c = 4 - big->l4;
    if (last-p < c) c = last-p;
    memcpy(big->bytes4 + big->l4, p, c);
    p += c;
    big->l4 += c;
    if (big->l4 == 4) {
      c = convert85(big->bytes4, big->chars5);
      fwrite(big->chars5, c, 1, output);
      big->l4 = 0;
      if (++big->blocks >= 16) { fputc('\n', output); big->blocks = 0; }
    }
  }
}